

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkparser.cpp
# Opt level: O2

void __thiscall
LinkParser::parseEnergy
          (LinkParser *this,Link *link,Network *network,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  InputError *pIVar4;
  Pattern *pPVar5;
  Curve *pCVar6;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  undefined1 local_70 [8];
  string keyword;
  allocator local_29;
  
  iVar3 = (*(link->super_Element)._vptr_Element[2])(link);
  if (iVar3 == 1) {
    pbVar1 = (tokenList->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(tokenList->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x80) {
      pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&local_110,"",(allocator *)local_70);
      InputError::InputError(pIVar4,2,&local_110);
      __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
    }
    std::__cxx11::string::string((string *)local_70,(string *)(pbVar1 + 2));
    std::__cxx11::string::string((string *)(keyword.field_2._M_local_buf + 8),"PRICE",&local_29);
    bVar2 = Utilities::match((string *)local_70,(string *)((long)&keyword.field_2 + 8));
    std::__cxx11::string::~string((string *)(keyword.field_2._M_local_buf + 8));
    if (bVar2) {
      bVar2 = Utilities::parseNumber<double>
                        (pbVar1 + 3,(double *)&link[2].super_Element.name._M_string_length);
      if (!bVar2) {
        pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_f0,(string *)(pbVar1 + 3));
        InputError::InputError(pIVar4,6,&local_f0);
        __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
      }
    }
    else {
      std::__cxx11::string::string((string *)(keyword.field_2._M_local_buf + 8),"PATTERN",&local_29)
      ;
      bVar2 = Utilities::match((string *)local_70,(string *)((long)&keyword.field_2 + 8));
      std::__cxx11::string::~string((string *)(keyword.field_2._M_local_buf + 8));
      if (bVar2) {
        pPVar5 = Network::pattern(network,pbVar1 + 3);
        link[2].super_Element.name._M_dataplus._M_p = (pointer)pPVar5;
        if (pPVar5 == (Pattern *)0x0) {
          pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string((string *)&local_d0,(string *)(pbVar1 + 3));
          InputError::InputError(pIVar4,5,&local_d0);
          __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
        }
      }
      else {
        std::__cxx11::string::string((string *)(keyword.field_2._M_local_buf + 8),"EFFIC",&local_29)
        ;
        bVar2 = Utilities::match((string *)local_70,(string *)((long)&keyword.field_2 + 8));
        std::__cxx11::string::~string((string *)(keyword.field_2._M_local_buf + 8));
        if (!bVar2) {
          pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string((string *)&local_90,(string *)local_70);
          InputError::InputError(pIVar4,3,&local_90);
          __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
        }
        pCVar6 = Network::curve(network,pbVar1 + 3);
        link[2].super_Element._vptr_Element = (_func_int **)pCVar6;
        if (pCVar6 == (Curve *)0x0) {
          pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string((string *)&local_b0,(string *)(pbVar1 + 3));
          InputError::InputError(pIVar4,5,&local_b0);
          __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
        }
      }
    }
    std::__cxx11::string::~string((string *)local_70);
  }
  return;
}

Assistant:

void LinkParser::parseEnergy(
        Link* link, Network* network, vector<string>& tokenList)
{
    // Contents of tokenList are:
    // 0 - PUMP keyword
    // 1 - pump ID
    // 2 - PRICE/PATTERN/EFFIC keyword
    // 3 - price value or ID of pattern or efficiency curve

    // ... cast link to a pump

    if ( link->type() != Link::PUMP ) return;
    Pump* pump = static_cast<Pump*>(link);

    // ... read keyword from input stream

    if ( tokenList.size() < 4) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string* tokens = &tokenList[0];
    string keyword = tokens[2];

    // ... read energy cost per Kwh

    if ( Utilities::match(keyword, w_Price) )
    {
        if ( !Utilities::parseNumber(tokens[3], pump->costPerKwh) )
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[3]);
        }
    }

    // ... read name of energy cost time pattern

    else if ( Utilities::match(keyword, w_Pattern) )
    {
        pump->costPattern = network->pattern(tokens[3]);
        if ( !pump->costPattern )
        {
            throw InputError(InputError::UNDEFINED_OBJECT, tokens[3]);
        }
    }

    // ... read name of pump efficiency curve

    else if ( Utilities::match(keyword, w_Effic) )
    {
        pump->efficCurve = network->curve(tokens[3]);
        if ( !pump->efficCurve )
        {
            throw InputError(InputError::UNDEFINED_OBJECT, tokens[3]);
        }
    }

    else throw InputError(InputError::INVALID_KEYWORD, keyword);
}